

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t *av,size_t n,char *port_args,MetaContainer meta)

{
  char cVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  long lVar5;
  rtosc_arg_val_t *prVar6;
  long lVar7;
  size_t sVar8;
  byte *pbVar9;
  size_t sVar11;
  byte *pbVar10;
  
  while (((byte)*port_args - 0x3a < 0x24 &&
         ((0xa00000001U >> ((ulong)((byte)*port_args - 0x3a) & 0x3f) & 1) != 0))) {
    port_args = (char *)((byte *)port_args + 1);
  }
  cVar1 = av->type;
  lVar5 = 1;
  prVar6 = av;
  sVar8 = n;
  if (cVar1 == 'a') {
    iVar3 = rtosc_av_arr_len(av);
    if (iVar3 == 0) {
      return 0;
    }
    lVar5 = (long)iVar3;
    prVar6 = av + 1;
    sVar8 = 1;
  }
  lVar7 = 0;
  do {
    if (sVar8 != 0) {
      sVar11 = 0;
      pbVar10 = (byte *)port_args;
LAB_00105fbb:
      do {
        pbVar9 = pbVar10 + 1;
        bVar2 = *pbVar10;
        pbVar10 = pbVar9;
        if (bVar2 < 0x5d) {
          if (bVar2 == 0x5b) goto LAB_00105fbb;
          if ((bVar2 == 0) || (bVar2 == 0x3a)) {
            return (int)n - (int)sVar11;
          }
        }
        else if (bVar2 == 0x5d) goto LAB_00105fbb;
        if ((bVar2 == 0x69) && (prVar6->type == 'S')) {
          iVar4 = enum_key(meta,(prVar6->val).s);
          prVar6->type = 'i';
          (prVar6->val).i = iVar4;
        }
        sVar11 = sVar11 + 1;
        prVar6 = prVar6 + 1;
      } while (sVar11 != sVar8);
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == lVar5) {
      if (cVar1 == 'a') {
        rtosc_av_arr_type_set(av,prVar6[-1].type);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t* av, size_t n,
                                 const char* port_args,
                                 Port::MetaContainer meta)
{
    const char* first0 = port_args;
    int errors_found = 0;

    // skip "[]:"
    for( ; *first0 && (*first0 == ':' || *first0 == '[' || *first0 == ']');
           ++first0) ;

    size_t arr_size;
    size_t max;
    bool is_array;
    rtosc_arg_val_t* start = av;
    if(av->type == 'a') {
        arr_size = rtosc_av_arr_len(av);
        ++av;
        max = 1; // only one element per bundle element
                 // TODO: multiple may be possible
        is_array = true;
    }
    else {
        arr_size = 1;
        max = n;
        is_array = false;
    }

    for(size_t a = 0; a < arr_size; ++a)
    {
        const char* first = first0;
        for(size_t i = 0; i < max; ++i, ++first, ++av)
        {
            // skip "[]"
            for( ; *first && (*first == '[' || *first == ']'); ++first) ;

            assert(!strchr(first0, '#'));

//            if(is_array) // TODO: currently, only one element per bundle element
//                assert(first[1] == 0);

            if(!*first || *first == ':')
            {
                // (n-i) arguments left, but we have no recipe to convert them
                return n-i;
            }

            if(av->type == 'S' && *first == 'i')
            {
                int val = enum_key(meta, av->val.s);
                if(val == std::numeric_limits<int>::min())
                    ++errors_found;
                else
                {
                    av->type = 'i';
                    av->val.i = val;
                }
            }
        }
    }
    if(is_array && arr_size)
        rtosc_av_arr_type_set(start, av[-1].type);

    return errors_found;
}